

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_712d::StatePointer_RegressionGitHubIssue4_Test::TestBody
          (StatePointer_RegressionGitHubIssue4_Test *this)

{
  bool bVar1;
  reference_type piVar2;
  char *message;
  state_ptr<int,_unsigned_long,_2UL> local_48;
  state_ptr<int,_unsigned_long,_2UL> underTest;
  int testData;
  int target;
  AssertionResult gtest_ar;
  Message local_20;
  
  underTest.m_ptr_and_state._0_4_ = 1;
  putl::state_ptr<int,_unsigned_long,_2UL>::state_ptr(&local_48,(pointer_type)&underTest,0);
  piVar2 = putl::state_ptr<int,_unsigned_long,_2UL>::operator*(&local_48);
  underTest.m_ptr_and_state._4_4_ = *piVar2;
  local_20.ss_.ptr_._0_4_ = 1;
  testing::internal::EqHelper<false>::Compare<int,int>
            ((EqHelper<false> *)&testData,"target","1",(int *)((long)&underTest.m_ptr_and_state + 4)
             ,(int *)&local_20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)&testData);
  if (!bVar1) {
    testing::Message::Message(&local_20);
    message = testing::AssertionResult::failure_message((AssertionResult *)&testData);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0xa0,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,&local_20);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(&local_20);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)&testData);
  return;
}

Assistant:

TEST(StatePointer, RegressionGitHubIssue4) {
	// Compile-time regression where apple-clang reported the following error:
	// 
	// [...]/state_ptr/include/putl/state_ptr.hpp:263:10: error: reinterpret_cast from rvalue to reference type
	//       'reference_type' (aka 'int &')
	//                 return reinterpret_cast<reference_type>(get_ptr());
	//                        ^~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~
	// [...]/state_ptr/testsrc/state_ptr_tests.cpp:119:18: note: in instantiation of member function
	//       'putl::state_ptr<int, unsigned long, 2>::operator*' requested here
	//     int target = *underTest;
	int testData = 1;
	putl::state_ptr<int> underTest{&testData, 0};
	int target = *underTest;
	ASSERT_EQ(target, 1);
}